

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O3

int ecjpake_mul_secret(mbedtls_mpi *R,int sign,mbedtls_mpi *X,mbedtls_mpi *S,mbedtls_mpi *N,
                      _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_40 [8];
  mbedtls_mpi b;
  
  mbedtls_mpi_init((mbedtls_mpi *)local_40);
  iVar1 = mbedtls_mpi_fill_random((mbedtls_mpi *)local_40,0x10,f_rng,p_rng);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_40,(mbedtls_mpi *)local_40,N);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_add_mpi((mbedtls_mpi *)local_40,(mbedtls_mpi *)local_40,S);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_mul_mpi(R,X,(mbedtls_mpi *)local_40);
        if (iVar1 == 0) {
          R->s = (short)sign * R->s;
          iVar1 = mbedtls_mpi_mod_mpi(R,R,N);
        }
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_40);
  return iVar1;
}

Assistant:

static int ecjpake_mul_secret(mbedtls_mpi *R, int sign,
                              const mbedtls_mpi *X,
                              const mbedtls_mpi *S,
                              const mbedtls_mpi *N,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi b; /* Blinding value, then s + N * blinding */

    mbedtls_mpi_init(&b);

    /* b = s + rnd-128-bit * N */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&b, 16, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&b, &b, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&b, &b, S));

    /* R = sign * X * b mod N */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(R, X, &b));
    R->s *= sign;
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(R, R, N));

cleanup:
    mbedtls_mpi_free(&b);

    return ret;
}